

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeLoadConstantLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RepeatedField<unsigned_long> *this_00;
  LogMessage *pLVar1;
  mapped_type *this_01;
  unsigned_long *puVar2;
  undefined1 *from;
  LoadConstantLayerParams load_constant;
  LogFinisher local_89;
  LogMessage local_88;
  LoadConstantLayerParams local_50;
  
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 0x122) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_LoadConstantLayerParams_default_instance_;
  }
  Specification::LoadConstantLayerParams::LoadConstantLayerParams
            (&local_50,(LoadConstantLayerParams *)from);
  ShapeConstraint::setSequence(this_01,1);
  ShapeConstraint::setBatch(this_01,1);
  if (local_50.shape_.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  this_00 = &local_50.shape_;
  puVar2 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  ShapeConstraint::setChannel(this_01,*puVar2);
  if (local_50.shape_.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  puVar2 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  ShapeConstraint::setHeight(this_01,puVar2[1]);
  if (local_50.shape_.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  puVar2 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  ShapeConstraint::setWidth(this_01,puVar2[2]);
  Specification::LoadConstantLayerParams::~LoadConstantLayerParams(&local_50);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeLoadConstantLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    Specification::LoadConstantLayerParams load_constant = specLayer.loadconstant();

    outputShape.setSequence(1);
    outputShape.setBatch(1);
    outputShape.setChannel((size_t)load_constant.shape(0));
    outputShape.setHeight((size_t)load_constant.shape(1));
    outputShape.setWidth((size_t)load_constant.shape(2));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}